

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

byte * __thiscall
Js::ByteCodeBufferReader::ReadReferencedPropertyIdMap
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  uint uVar1;
  PropertyId propertyId;
  undefined8 in_RAX;
  uint i;
  uint mapIndex;
  undefined8 uStack_38;
  int value;
  
  uStack_38 = in_RAX;
  uVar1 = FunctionBody::GetReferencedPropertyIdCount(function);
  if (uVar1 != 0) {
    FunctionBody::CreateReferencedPropertyIdMap(function);
    for (mapIndex = 0; uVar1 != mapIndex; mapIndex = mapIndex + 1) {
      current = ReadInt32(this,current,(int *)((long)&uStack_38 + 4));
      propertyId = ByteCodeCache::LookupNonBuiltinPropertyId
                             (function->byteCodeCache,uStack_38._4_4_);
      FunctionBody::SetReferencedPropertyIdWithMapIndex(function,mapIndex,propertyId);
    }
    FunctionBody::VerifyReferencedPropertyIdMap(function);
  }
  return current;
}

Assistant:

const byte * ReadReferencedPropertyIdMap(const byte * current, FunctionBody * function)
    {
        uint count = function->GetReferencedPropertyIdCount();
        if (count == 0)
        {
            return current;
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfReferencedPropIdMap);
#endif

        function->CreateReferencedPropertyIdMap();

        for (uint i = 0; i < count; i++)
        {
            int value;
            current = ReadInt32(current, &value);
            PropertyId propertyId = function->GetByteCodeCache()->LookupNonBuiltinPropertyId(value);
            function->SetReferencedPropertyIdWithMapIndex(i, propertyId);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfReferencedPropIdMap);
#endif
#if DBG
        function->VerifyReferencedPropertyIdMap();
#endif
        return current;
    }